

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_internal.h
# Opt level: O0

void absl::cord_internal::SmallMemmove<true>(char *dst,char *src,size_t n)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint32_t buf2_1;
  uint32_t buf1_1;
  uint64_t buf2;
  uint64_t buf1;
  size_t n_local;
  char *src_local;
  char *dst_local;
  
  if (n < 8) {
    if (n < 4) {
      if (n != 0) {
        *dst = *src;
        dst[n >> 1] = src[n >> 1];
        dst[n - 1] = src[n - 1];
      }
      memset(dst + 7,0,8);
      memset(dst + n,0,8);
    }
    else {
      uVar1 = *(undefined4 *)src;
      uVar2 = *(undefined4 *)(src + (n - 4));
      memset(dst + 4,0,4);
      memset(dst + 7,0,8);
      *(undefined4 *)dst = uVar1;
      *(undefined4 *)(dst + (n - 4)) = uVar2;
    }
  }
  else {
    if (0xf < n) {
      __assert_fail("n <= 15",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O0/_deps/abseil-cpp-src/absl/strings/internal/cord_internal.h"
                    ,0x61,
                    "void absl::cord_internal::SmallMemmove(char *, const char *, size_t) [nullify_tail = true]"
                   );
    }
    uVar3 = *(undefined8 *)src;
    uVar4 = *(undefined8 *)(src + (n - 8));
    memset(dst + 7,0,8);
    *(undefined8 *)dst = uVar3;
    *(undefined8 *)(dst + (n - 8)) = uVar4;
  }
  return;
}

Assistant:

inline void SmallMemmove(char* dst, const char* src, size_t n) {
  if (n >= 8) {
    assert(n <= 15);
    uint64_t buf1;
    uint64_t buf2;
    memcpy(&buf1, src, 8);
    memcpy(&buf2, src + n - 8, 8);
    if (nullify_tail) {
      memset(dst + 7, 0, 8);
    }
    // GCC 12 has a false-positive -Wstringop-overflow warning here.
#if ABSL_INTERNAL_HAVE_MIN_GNUC_VERSION(12, 0)
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wstringop-overflow"
#endif
    memcpy(dst, &buf1, 8);
    memcpy(dst + n - 8, &buf2, 8);
#if ABSL_INTERNAL_HAVE_MIN_GNUC_VERSION(12, 0)
#pragma GCC diagnostic pop
#endif
  } else if (n >= 4) {
    uint32_t buf1;
    uint32_t buf2;
    memcpy(&buf1, src, 4);
    memcpy(&buf2, src + n - 4, 4);
    if (nullify_tail) {
      memset(dst + 4, 0, 4);
      memset(dst + 7, 0, 8);
    }
    memcpy(dst, &buf1, 4);
    memcpy(dst + n - 4, &buf2, 4);
  } else {
    if (n != 0) {
      dst[0] = src[0];
      dst[n / 2] = src[n / 2];
      dst[n - 1] = src[n - 1];
    }
    if (nullify_tail) {
      memset(dst + 7, 0, 8);
      memset(dst + n, 0, 8);
    }
  }
}